

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRasterizationTests.cpp
# Opt level: O0

TestInstance * __thiscall
vkt::rasterization::anon_unknown_0::FillRuleTestCase::createInstance
          (FillRuleTestCase *this,Context *context)

{
  FillRuleTestInstance *this_00;
  Context *context_local;
  FillRuleTestCase *this_local;
  
  this_00 = (FillRuleTestInstance *)operator_new(0x290);
  FillRuleTestInstance::FillRuleTestInstance
            (this_00,context,this->m_type,(this->super_BaseRenderingTestCase).m_sampleCount);
  return (TestInstance *)this_00;
}

Assistant:

virtual TestInstance*		createInstance		(Context& context) const
								{
									return new FillRuleTestInstance(context, m_type, m_sampleCount);
								}